

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::ternary_each<signed_char>
          (Omega_h *this,Bytes *cond,Read<signed_char> *a,Read<signed_char> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  int iVar3;
  int iVar4;
  void *extraout_RDX;
  LO LVar5;
  Read<signed_char> RVar6;
  Write<signed_char> c;
  type f;
  allocator local_99;
  Write<signed_char> local_98;
  Write<signed_char> local_88;
  type local_78;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar3 = (int)pAVar1->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar1 >> 3);
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar4 = (int)pAVar2->size;
  }
  else {
    iVar4 = (int)((ulong)pAVar2 >> 3);
  }
  if (iVar3 == iVar4) {
    if (((ulong)pAVar1 & 1) == 0) {
      iVar3 = (int)pAVar1->size;
    }
    else {
      iVar3 = (int)((ulong)pAVar1 >> 3);
    }
    pAVar1 = (cond->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      iVar4 = (int)pAVar1->size;
    }
    else {
      iVar4 = (int)((ulong)pAVar1 >> 3);
    }
    local_78.width = divide_no_remainder<int>(iVar3,iVar4);
    pAVar1 = (a->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      LVar5 = (LO)pAVar1->size;
    }
    else {
      LVar5 = (LO)((ulong)pAVar1 >> 3);
    }
    std::__cxx11::string::string((string *)&local_78,"",&local_99);
    Write<signed_char>::Write(&local_98,LVar5,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Write<signed_char>::Write(&local_78.c,&local_98);
    Write<signed_char>::Write(&local_78.cond.write_,&cond->write_);
    Write<signed_char>::Write(&local_78.a.write_,&a->write_);
    Write<signed_char>::Write(&local_78.b.write_,&b->write_);
    if (((ulong)local_98.shared_alloc_.alloc & 1) == 0) {
      LVar5 = (LO)(local_98.shared_alloc_.alloc)->size;
    }
    else {
      LVar5 = (LO)((ulong)local_98.shared_alloc_.alloc >> 3);
    }
    parallel_for<Omega_h::ternary_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (LVar5,&local_78,"ternary_each");
    Write<signed_char>::Write(&local_88,&local_98);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_88);
    Write<signed_char>::~Write(&local_88);
    ternary_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
    ::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_78);
    Write<signed_char>::~Write(&local_98);
    RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x137);
}

Assistant:

Read<T> ternary_each(Bytes cond, Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto width = divide_no_remainder(a.size(), cond.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = cond[i / width] ? a[i] : b[i]; };
  parallel_for(c.size(), f, "ternary_each");
  return c;
}